

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

int test(void)

{
  byte extraout_AL;
  byte extraout_AL_00;
  int iVar1;
  int iVar2;
  ostream *poVar3;
  My *pMVar4;
  NoCopy *pNVar5;
  MyMock *pMVar6;
  char *pcVar7;
  undefined1 *puVar8;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  int iVar9;
  function<bool_()> *this;
  int in_R8D;
  float fVar10;
  anon_class_1_0_00000001 local_f1;
  function<float_(float)> local_f0;
  raii_mock<float_(float)> local_d0;
  raii_mock<float_(float)> _mockaron_function_mock85;
  function<int_(int)> local_c0;
  raii_mock<int_(int)> local_a0;
  raii_mock<int_(int)> _mockaron_function_mock83;
  function<bool_()> local_90;
  raii_mock<bool_()> local_70;
  raii_mock<bool_()> _mockaron_function_mock78;
  function<const_char_*(int,_char)> local_60;
  raii_mock<const_char_*(int,_char)> local_40;
  raii_mock<const_char_*(int,_char)> _mockaron_function_mock74;
  mock<My,_MyMock> local_30;
  mock<My,_MyMock> mock;
  My local_14;
  My real;
  int failure;
  
  real._i = 0;
  My::My(&local_14,3.14);
  iVar1 = My::f(&local_14,4);
  if (iVar1 != 0x10) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Check failed: real.f(4) == 16");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    real._i = real._i + 1;
  }
  mockaron::mock<My,_MyMock>::mock(&local_30);
  pMVar4 = mockaron::mock<My,_MyMock>::get(&local_30);
  iVar1 = My::f(pMVar4,4);
  if (iVar1 != 8) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Check failed: mock.get().f(4) == 8");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    real._i = real._i + 1;
  }
  pMVar4 = mockaron::mock<My,_MyMock>::get(&local_30);
  _mockaron_function_mock74.ref._4_4_ = 4;
  iVar1 = My::g(pMVar4,(int *)((long)&_mockaron_function_mock74.ref + 4));
  if (iVar1 != 8) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Check failed: mock.get().g(4) == 8");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    real._i = real._i + 1;
  }
  pMVar4 = mockaron::mock<My,_MyMock>::get(&local_30);
  fVar10 = My::g(pMVar4,2.0);
  if ((fVar10 != 4.0) || (NAN(fVar10))) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Check failed: mock.get().g(2.0f) == 4.0f");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    real._i = real._i + 1;
  }
  pMVar4 = mockaron::mock<My,_MyMock>::get(&local_30);
  iVar1 = My::h(pMVar4,2);
  if (iVar1 != 4) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Check failed: mock.get().h(2) == 4");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    real._i = real._i + 1;
  }
  pMVar4 = mockaron::mock<My,_MyMock>::get(&local_30);
  iVar1 = My::i(pMVar4);
  if (iVar1 != 2) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Check failed: mock.get().i() == 2");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    real._i = real._i + 1;
  }
  pMVar4 = mockaron::mock<My,_MyMock>::get(&local_30);
  My::j(pMVar4);
  pMVar4 = mockaron::mock<My,_MyMock>::get(&local_30);
  pNVar5 = My::k(pMVar4);
  pMVar6 = mockaron::mock<My,_MyMock>::get_mock_impl(&local_30);
  puVar8 = &pMVar6->field_0x44;
  if (pNVar5 != (NoCopy *)puVar8) {
    poVar3 = std::operator<<((ostream *)&std::cerr,
                             "Check failed: &mock.get().k() == &mock.get_mock_impl().no");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    real._i = real._i + 1;
  }
  iVar1 = (int)puVar8;
  pMVar6 = mockaron::mock<My,_MyMock>::get_mock_impl(&local_30);
  if (pMVar6->z != 0x2a) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Check failed: mock.get_mock_impl().z == 42");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    real._i = real._i + 1;
  }
  iVar2 = My::f(&local_14,4);
  if (iVar2 != 0x10) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Check failed: real.f(4) == 16");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    real._i = real._i + 1;
  }
  poVar3 = (ostream *)My::l(8,'\0');
  iVar9 = 0x11230e;
  iVar2 = strcmp((char *)poVar3,"fortytwo");
  pcVar7 = extraout_RDX;
  if (iVar2 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,
                             "Check failed: !std::strcmp(My::l(8, 0), \"fortytwo\")");
    iVar9 = 0x11f040;
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    real._i = real._i + 1;
    pcVar7 = extraout_RDX_00;
  }
  My::m(poVar3,iVar9,pcVar7,iVar1,in_R8D);
  if ((extraout_AL & 1) != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Check failed: !My::m()");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    real._i = real._i + 1;
  }
  iVar2 = My::n(2);
  if (iVar2 != 4) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Check failed: My::n(2) == 4");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    real._i = real._i + 1;
  }
  fVar10 = My::n(2.0);
  if ((fVar10 != 4.0) || (NAN(fVar10))) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Check failed: My::n(2.f) == 4.f");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    real._i = real._i + 1;
  }
  std::function<char_const*(int,char)>::function<test()::__0,void>
            ((function<char_const*(int,char)> *)&local_60,
             (anon_class_1_0_00000001 *)((long)&_mockaron_function_mock78.ref + 7));
  mockaron::detail::raii_mock<const_char_*(int,_char)>::raii_mock(&local_40,My::l,&local_60);
  std::function<const_char_*(int,_char)>::~function(&local_60);
  pcVar7 = My::l(8,'\0');
  iVar2 = strcmp(pcVar7,"roflol");
  if (iVar2 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,
                             "Check failed: !std::strcmp(My::l(8, 0), \"roflol\")");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    real._i = real._i + 1;
  }
  mockaron::detail::raii_mock<const_char_*(int,_char)>::~raii_mock(&local_40);
  std::function<bool()>::function<test()::__1,void>
            ((function<bool()> *)&local_90,
             (anon_class_1_0_00000001 *)((long)&_mockaron_function_mock83.ref + 7));
  iVar2 = 0x10b7a0;
  mockaron::detail::raii_mock<bool_()>::raii_mock(&local_70,My::m,&local_90);
  this = &local_90;
  std::function<bool_()>::~function(this);
  My::m(this,iVar2,extraout_RDX_01,iVar1,in_R8D);
  if ((extraout_AL_00 & 1) == 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Check failed: My::m()");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    real._i = real._i + 1;
  }
  mockaron::detail::raii_mock<bool_()>::~raii_mock(&local_70);
  std::function<int(int)>::function<test()::__2,void>
            ((function<int(int)> *)&local_c0,
             (anon_class_1_0_00000001 *)((long)&_mockaron_function_mock85.ref + 7));
  mockaron::detail::raii_mock<int_(int)>::raii_mock(&local_a0,My::n,&local_c0);
  std::function<int_(int)>::~function(&local_c0);
  std::function<float(float)>::function<test()::__3,void>
            ((function<float(float)> *)&local_f0,&local_f1);
  mockaron::detail::raii_mock<float_(float)>::raii_mock(&local_d0,My::n,&local_f0);
  std::function<float_(float)>::~function(&local_f0);
  iVar1 = My::n(2);
  if (iVar1 != 8) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Check failed: My::n(2) == 8");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    real._i = real._i + 1;
  }
  fVar10 = My::n(2.0);
  if ((fVar10 != 16.0) || (NAN(fVar10))) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Check failed: My::n(2.f) == 16.f");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    real._i = real._i + 1;
  }
  mockaron::detail::raii_mock<float_(float)>::~raii_mock(&local_d0);
  mockaron::detail::raii_mock<int_(int)>::~raii_mock(&local_a0);
  iVar1 = real._i;
  mockaron::mock<My,_MyMock>::~mock(&local_30);
  My::~My(&local_14);
  return iVar1;
}

Assistant:

int test()
{
  int failure = 0;
  My real(3.14);
  CHECK(real.f(4) == 16);

  mockaron::mock<My, MyMock> mock;

  CHECK(mock.get().f(4) == 8);
  CHECK(mock.get().g(4) == 8);
  CHECK(mock.get().g(2.0f) == 4.0f);
  CHECK(mock.get().h(2) == 4);
  CHECK(mock.get().i() == 2);
  mock.get().j();
  CHECK(&mock.get().k() == &mock.get_mock_impl().no);
  CHECK(mock.get_mock_impl().z == 42);

  CHECK(real.f(4) == 16);

  CHECK(!std::strcmp(My::l(8, 0), "fortytwo"));
  CHECK(!My::m());
  CHECK(My::n(2) == 4);
  CHECK(My::n(2.f) == 4.f);

  {
    MOCKARON_SET_FUNCTION_IMPL(My::l, [](int i, char) {
      if (i == 8)
        return "roflol";
      return (char const*)nullptr;
    });
    CHECK(!std::strcmp(My::l(8, 0), "roflol"));
  }
  {
    MOCKARON_SET_FUNCTION_IMPL(My::m, []() { return true; });
    CHECK(My::m());
  }
  {
    MOCKARON_SET_FUNCTION_IMPL(static_cast<int (*)(int)>(My::n),
                               [](int i) { return i * 4; });
    MOCKARON_SET_FUNCTION_IMPL(static_cast<float (*)(float)>(My::n),
                               [](float i) { return i * 8; });
    CHECK(My::n(2) == 8);
    CHECK(My::n(2.f) == 16.f);
  }

  return failure;
}